

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

double fas154x_seas(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  double *A;
  void *pvVar4;
  double *theta;
  double *P;
  int iVar5;
  int iVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  int iVar13;
  uint ip;
  size_t __size;
  long lVar14;
  double dVar15;
  double dVar16;
  double extraout_XMM0_Qa;
  double local_a8;
  double ssq;
  double sumlog;
  double *local_90;
  int local_88;
  int local_84;
  int nit;
  int iter;
  long local_78;
  ulong local_70;
  void *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  ulong local_48;
  size_t local_40;
  double local_38;
  
  ssq = 0.0;
  local_a8 = 0.0;
  local_38 = (double)(ulong)*params;
  uVar1 = *(uint *)((long)params + 8);
  iVar8 = *(int *)((long)params + 0xc);
  lVar14 = (long)iVar8;
  local_48 = (ulong)*(uint *)((long)params + 0x10);
  _nit = (ulong)*(uint *)((long)params + 0x18);
  iVar5 = *(int *)((long)params + 0x1c);
  local_70 = (ulong)*(uint *)((long)params + 0x28);
  uVar2 = *(uint *)((long)params + 0x2c);
  local_78 = (long)*(int *)((long)params + 0x50);
  local_40 = (long)iVar5 * 8;
  local_68 = params;
  sumlog = (double)malloc(local_40);
  local_60 = (double *)malloc(local_40);
  local_90 = (double *)malloc(local_40);
  __size = (long)(((iVar5 + 1) * iVar5) / 2) << 3;
  local_58 = (double *)malloc(__size);
  dVar16 = sumlog;
  local_50 = (double *)malloc(__size);
  if (0 < (long)iVar5) {
    memset((void *)dVar16,0,local_40);
    memset(local_60,0,local_40);
  }
  if (0 < SUB84(local_38,0)) {
    memcpy((void *)dVar16,b,(long)local_38 * 8);
  }
  iVar5 = SUB84(local_38,0);
  if (0 < (int)uVar1) {
    memcpy(local_60,b + iVar5,(ulong)uVar1 * 8);
    iVar5 = SUB84(local_38,0);
  }
  P = local_58;
  theta = local_60;
  pvVar4 = local_68;
  A = local_90;
  iVar13 = (int)local_48;
  if (0 < iVar13) {
    lVar9 = lVar14 * 8 + (long)dVar16;
    uVar10 = 0;
    do {
      dVar15 = b[(long)(int)(iVar5 + uVar1) + uVar10];
      uVar10 = uVar10 + 1;
      *(double *)((long)dVar16 + -8 + uVar10 * lVar14 * 8) =
           *(double *)((long)dVar16 + -8 + uVar10 * lVar14 * 8) + dVar15;
      if (0 < local_38._0_4_) {
        uVar12 = 0;
        do {
          *(double *)(lVar9 + uVar12 * 8) = *(double *)(lVar9 + uVar12 * 8) - b[uVar12] * dVar15;
          uVar12 = uVar12 + 1;
        } while (((ulong)local_38 & 0xffffffff) != uVar12);
      }
      lVar9 = lVar9 + lVar14 * 8;
    } while (uVar10 != local_48);
  }
  iVar5 = iVar5 + uVar1 + iVar13;
  iVar6 = (int)_nit;
  local_48 = (ulong)(int)local_70;
  if (0 < iVar6) {
    uVar10 = 0;
    pdVar7 = local_60;
    do {
      pdVar7 = pdVar7 + lVar14;
      dVar15 = b[(long)iVar5 + uVar10];
      uVar10 = uVar10 + 1;
      local_60[uVar10 * lVar14 + -1] = local_60[uVar10 * lVar14 + -1] + dVar15;
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          pdVar7[uVar12] = b[(long)local_38._0_4_ + uVar12] * dVar15 + pdVar7[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
      }
    } while (uVar10 != _nit);
  }
  ip = iVar13 * iVar8 + local_38._0_4_;
  iVar8 = iVar6 * iVar8 + uVar1;
  local_40 = CONCAT44(local_40._4_4_,iVar8);
  if (0 < (int)local_70 && 0 < (int)uVar2) {
    pdVar7 = (double *)((long)local_68 + (long)((int)local_70 * 3 + (int)local_78) * 8 + 0x58);
    uVar10 = 0;
    do {
      dVar15 = *(double *)
                ((long)local_68 + (uVar10 + (long)((int)local_78 + (int)local_70 * 2)) * 8 + 0x58);
      uVar12 = 0;
      pdVar11 = pdVar7;
      do {
        dVar15 = dVar15 - *pdVar11 * b[(long)(iVar5 + iVar6) + uVar12];
        uVar12 = uVar12 + 1;
        pdVar11 = pdVar11 + local_70;
      } while (uVar2 != uVar12);
      *(double *)((long)local_68 + (local_78 + uVar10) * 8 + 0x58) = dVar15;
      uVar10 = uVar10 + 1;
      pdVar7 = pdVar7 + 1;
    } while (uVar10 != local_70);
  }
  bVar3 = 1 < ip || iVar8 != 0;
  if (bVar3) {
    starma(ip,iVar8,(double *)dVar16,local_60,local_90,local_58,local_50);
    dVar16 = extraout_XMM0_Qa;
    iVar8 = (int)local_40;
  }
  else {
    *local_50 = 1.0;
    *local_90 = 0.0;
    dVar16 = *(double *)dVar16 * *(double *)dVar16;
    *local_58 = 1.0 / (1.0 - dVar16);
  }
  pdVar11 = local_50;
  dVar15 = sumlog;
  local_38 = (double)(ulong)bVar3;
  local_88 = 0;
  pdVar7 = (double *)((long)pvVar4 + local_78 * 8 + 0x58);
  karma(ip,iVar8,(double *)sumlog,theta,A,P,local_50,(int)local_70,pdVar7,pdVar7 + local_48,&ssq,
        &local_a8,(uint)bVar3,dVar16,&local_84,&local_88);
  pvVar4 = local_68;
  *(double *)((long)local_68 + 0x40) = local_a8;
  local_38 = ssq / (double)local_84;
  dVar16 = log(local_a8 / (double)local_84);
  local_38 = (dVar16 + local_38) * 0.5;
  *(double *)((long)pvVar4 + 0x48) = local_38;
  free((void *)dVar15);
  free(theta);
  free(A);
  free(local_58);
  free(pdVar11);
  return local_38;
}

Assistant:

double fas154x_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta,temp;
	int p, q, ps, qs,s,offset,naram,M;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V,*reg;

	value = ssq = sumlog = 0.0;
	xlik_object obj = (xlik_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	M = obj->M;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;
	naram = p + q + ps + qs;
	reg = &obj->x[offset+3*N];
	//mdisplay(reg,M,N);

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	
	/*
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	*/

	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	
	iupd = 0;

	if ((ip == 1 && iq == 0) || (ip == 0 && iq == 0)) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}